

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O3

void print_usage(void)

{
  fprintf(_stderr,"%s - dump CAN bus traffic.\n",progname);
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>+\n",progname);
  fprintf(_stderr,"  (use CTRL-C to terminate %s)\n\n",progname);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -t <type>   (timestamp: (a)bsolute/(d)elta/(z)ero/(A)bsolute w date)\n",0x4e,1,
         _stderr);
  fwrite("         -H          (read hardware timestamps instead of system timestamps)\n",0x4d,1,
         _stderr);
  fwrite("         -c          (increment color mode level)\n",0x32,1,_stderr);
  fwrite("         -i          (binary output - may exceed 80 chars/line)\n",0x40,1,_stderr);
  fwrite("         -a          (enable additional ASCII output)\n",0x36,1,_stderr);
  fprintf(_stderr,
          "         -S          (swap byte order in printed CAN data[] - marked with \'%c\' )\n",
          0x60);
  fprintf(_stderr,
          "         -s <level>  (silent mode - %d: off (default) %d: animation %d: silent)\n",0,1,2)
  ;
  fprintf(_stderr,"         -l          (log CAN-frames into file. Sets \'-s %d\' by default)\n",2);
  fprintf(_stderr,
          "         -f <fname>  (log CAN-frames into file <fname>. Sets \'-s %d\' by default)\n",2);
  fwrite("         -L          (use log file format on stdout)\n",0x35,1,_stderr);
  fwrite("         -n <count>  (terminate after reception of <count> CAN frames)\n",0x47,1,_stderr);
  fwrite("         -r <size>   (set socket receive buffer to <size>)\n",0x3b,1,_stderr);
  fwrite("         -D          (Don\'t exit if a \"detected\" can device goes down)\n",0x47,1,
         _stderr);
  fwrite("         -d          (monitor dropped CAN frames)\n",0x32,1,_stderr);
  fwrite("         -e          (dump CAN error frames in human-readable format)\n",0x46,1,_stderr);
  fwrite("         -8          (display raw DLC values in {} for Classical CAN)\n",0x46,1,_stderr);
  fwrite("         -x          (print extra message infos, rx/tx brs esi)\n",0x40,1,_stderr);
  fwrite("         -T <msecs>  (terminate after <msecs> if no frames were received)\n",0x4a,1,
         _stderr);
  fputc(10,_stderr);
  fprintf(_stderr,"Up to %d CAN interfaces with optional filter sets can be specified\n",0x10);
  fwrite("on the commandline in the form: <ifname>[,filter]*\n",0x33,1,_stderr);
  fwrite("\nFilters:\n",10,1,_stderr);
  fwrite("  Comma separated filters can be specified for each given CAN interface:\n",0x49,1,_stderr
        );
  fwrite("    <can_id>:<can_mask>\n         (matches when <received_can_id> & mask == can_id & mask)\n"
         ,0x5a,1,_stderr);
  fwrite("    <can_id>~<can_mask>\n         (matches when <received_can_id> & mask != can_id & mask)\n"
         ,0x5a,1,_stderr);
  fwrite("    #<error_mask>\n         (set error frame filter, see include/linux/can/error.h)\n",
         0x53,1,_stderr);
  fwrite("    [j|J]\n         (join the given CAN filters - logical AND semantic)\n",0x47,1,_stderr)
  ;
  fwrite("\nCAN IDs, masks and data content are given and expected in hexadecimal values.\n",0x4f,1,
         _stderr);
  fwrite("When the can_id is 8 digits long the CAN_EFF_FLAG is set for 29 bit EFF format.\n",0x50,1,
         _stderr);
  fwrite("Without any given filter all data frames are received (\'0:0\' default filter).\n",0x4e,1,
         _stderr);
  fprintf(_stderr,"\nUse interface name \'%s\' to receive from all CAN interfaces.\n","any");
  fwrite("\nExamples:\n",0xb,1,_stderr);
  fprintf(_stderr,"%s -c -c -ta can0,123:7FF,400:700,#000000FF can2,400~7F0 can3 can8\n\n",progname)
  ;
  fprintf(_stderr,
          "%s -l any,0~0,#FFFFFFFF\n         (log only error frames but no(!) data frames)\n",
          progname);
  fprintf(_stderr,"%s -l any,0:0,#FFFFFFFF\n         (log error frames and also all data frames)\n",
          progname);
  fprintf(_stderr,"%s vcan2,12345678:DFFFFFFF\n         (match only for extended CAN ID 12345678)\n"
          ,progname);
  fprintf(_stderr,"%s vcan2,123:7FF\n         (matches CAN ID 123 - including EFF and RTR frames)\n"
          ,progname);
  fprintf(_stderr,
          "%s vcan2,123:C00007FF\n         (matches CAN ID 123 - only SFF and non-RTR frames)\n",
          progname);
  fputc(10,_stderr);
  return;
}

Assistant:

static void print_usage(void)
{
	fprintf(stderr, "%s - dump CAN bus traffic.\n", progname);
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>+\n", progname);
	fprintf(stderr, "  (use CTRL-C to terminate %s)\n\n", progname);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -t <type>   (timestamp: (a)bsolute/(d)elta/(z)ero/(A)bsolute w date)\n");
	fprintf(stderr, "         -H          (read hardware timestamps instead of system timestamps)\n");
	fprintf(stderr, "         -c          (increment color mode level)\n");
	fprintf(stderr, "         -i          (binary output - may exceed 80 chars/line)\n");
	fprintf(stderr, "         -a          (enable additional ASCII output)\n");
	fprintf(stderr, "         -S          (swap byte order in printed CAN data[] - marked with '%c' )\n", SWAP_DELIMITER);
	fprintf(stderr, "         -s <level>  (silent mode - %d: off (default) %d: animation %d: silent)\n", SILENT_OFF, SILENT_ANI, SILENT_ON);
	fprintf(stderr, "         -l          (log CAN-frames into file. Sets '-s %d' by default)\n", SILENT_ON);
	fprintf(stderr, "         -f <fname>  (log CAN-frames into file <fname>. Sets '-s %d' by default)\n", SILENT_ON);
	fprintf(stderr, "         -L          (use log file format on stdout)\n");
	fprintf(stderr, "         -n <count>  (terminate after reception of <count> CAN frames)\n");
	fprintf(stderr, "         -r <size>   (set socket receive buffer to <size>)\n");
	fprintf(stderr, "         -D          (Don't exit if a \"detected\" can device goes down)\n");
	fprintf(stderr, "         -d          (monitor dropped CAN frames)\n");
	fprintf(stderr, "         -e          (dump CAN error frames in human-readable format)\n");
	fprintf(stderr, "         -8          (display raw DLC values in {} for Classical CAN)\n");
	fprintf(stderr, "         -x          (print extra message infos, rx/tx brs esi)\n");
	fprintf(stderr, "         -T <msecs>  (terminate after <msecs> if no frames were received)\n");
	fprintf(stderr, "\n");
	fprintf(stderr, "Up to %d CAN interfaces with optional filter sets can be specified\n", MAXSOCK);
	fprintf(stderr, "on the commandline in the form: <ifname>[,filter]*\n");
	fprintf(stderr, "\nFilters:\n");
	fprintf(stderr, "  Comma separated filters can be specified for each given CAN interface:\n");
	fprintf(stderr, "    <can_id>:<can_mask>\n         (matches when <received_can_id> & mask == can_id & mask)\n");
	fprintf(stderr, "    <can_id>~<can_mask>\n         (matches when <received_can_id> & mask != can_id & mask)\n");
	fprintf(stderr, "    #<error_mask>\n         (set error frame filter, see include/linux/can/error.h)\n");
	fprintf(stderr, "    [j|J]\n         (join the given CAN filters - logical AND semantic)\n");
	fprintf(stderr, "\nCAN IDs, masks and data content are given and expected in hexadecimal values.\n");
	fprintf(stderr, "When the can_id is 8 digits long the CAN_EFF_FLAG is set for 29 bit EFF format.\n");
	fprintf(stderr, "Without any given filter all data frames are received ('0:0' default filter).\n");
	fprintf(stderr, "\nUse interface name '%s' to receive from all CAN interfaces.\n", ANYDEV);
	fprintf(stderr, "\nExamples:\n");
	fprintf(stderr, "%s -c -c -ta can0,123:7FF,400:700,#000000FF can2,400~7F0 can3 can8\n\n", progname);
	fprintf(stderr, "%s -l any,0~0,#FFFFFFFF\n         (log only error frames but no(!) data frames)\n", progname);
	fprintf(stderr, "%s -l any,0:0,#FFFFFFFF\n         (log error frames and also all data frames)\n", progname);
	fprintf(stderr, "%s vcan2,12345678:DFFFFFFF\n         (match only for extended CAN ID 12345678)\n", progname);
	fprintf(stderr, "%s vcan2,123:7FF\n         (matches CAN ID 123 - including EFF and RTR frames)\n", progname);
	fprintf(stderr, "%s vcan2,123:C00007FF\n         (matches CAN ID 123 - only SFF and non-RTR frames)\n", progname);
	fprintf(stderr, "\n");
}